

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StatementBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          StatementBlockKind *args_3,VariableLifetime *args_4)

{
  string_view name;
  StatementBlockSymbol *this_00;
  char *in_RCX;
  char *in_RSI;
  size_t in_R8;
  SourceLocation in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  Compilation *in_stack_ffffffffffffffc0;
  StatementBlockSymbol *in_stack_ffffffffffffffc8;
  
  this_00 = (StatementBlockSymbol *)
            allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_RSI);
  name._M_str = in_RCX;
  name._M_len = in_R8;
  ast::StatementBlockSymbol::StatementBlockSymbol
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,name,in_R9,
             (StatementBlockKind)((ulong)*(undefined8 *)in_RCX >> 0x20),(VariableLifetime)in_RSI);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }